

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

double mpack_load_double(char *p)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)p;
  return (double)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                  (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                  (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                 | uVar1 << 0x38);
}

Assistant:

MPACK_INLINE double mpack_load_double(const char* p) {
    MPACK_CHECK_FLOAT_ORDER();
    union {
        double d;
        uint64_t u;
    } v;
    v.u = mpack_load_u64(p);
    return v.d;
}